

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstarCluster.cpp
# Opt level: O0

PartialPolicyPoolItemInterface_sharedPtr __thiscall
GMAA_MAAstarCluster::NewPPI(GMAA_MAAstarCluster *this,PJPDP_sharedPtr *jp,double v)

{
  shared_count extraout_RDX;
  shared_ptr<PartialPolicyPoolItemInterface> *in_RDI;
  type tVar1;
  PartialPolicyPoolItemInterface_sharedPtr PVar2;
  double *in_stack_00000010;
  shared_ptr<PartialJointPolicyDiscretePure> *in_stack_00000018;
  PartialPolicyPoolItemInterface_sharedPtr *ppi;
  undefined1 local_38 [23];
  undefined1 local_21;
  
  local_21 = 0;
  tVar1 = boost::
          make_shared<PartialJPDPValuePair,boost::shared_ptr<PartialJointPolicyDiscretePure>const&,double&>
                    (in_stack_00000018,in_stack_00000010);
  boost::shared_ptr<PartialPolicyPoolItemInterface>::shared_ptr<PartialJPDPValuePair>
            (in_RDI,local_38,tVar1.pn.pi_.pi_);
  boost::shared_ptr<PartialJPDPValuePair>::~shared_ptr((shared_ptr<PartialJPDPValuePair> *)0x96e5d8)
  ;
  PVar2.pn.pi_ = extraout_RDX.pi_;
  PVar2.px = (element_type *)in_RDI;
  return PVar2;
}

Assistant:

PartialPolicyPoolItemInterface_sharedPtr
GMAA_MAAstarCluster::NewPPI(const PJPDP_sharedPtr &jp, double v) const
{
    //the index variant can not store a JointPolicyPureVectorForClusteredBG!
    //PartialPolicyPoolItemInterface* ppi=new JPPVIndexValPair(jp,v);
    //delete jp;//We can't delete the joint policy!
    PartialPolicyPoolItemInterface_sharedPtr ppi=boost::make_shared<PartialJPDPValuePair>(jp,v);
    return (ppi);
}